

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmain.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *__format;
  EVP_PKEY_CTX *ctx;
  FILE *__stream;
  double dVar4;
  allocator local_61;
  double local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ctx = (EVP_PKEY_CTX *)argv;
  i18n_setup();
  Midi_Db::init(&midi_db,ctx);
  pcVar3 = getenv("HOME");
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_38,pcVar3,&local_61);
    std::operator+(&local_58,&local_38,"/.config/adlrt.conf");
    std::__cxx11::string::operator=((string *)&arg_config_file_abi_cxx11_,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
LAB_001129ee:
  do {
    while (iVar2 = generic_getopt(argc,argv,"L:A:M:C",usage), iVar2 == 0x41) {
      arg_audio_api = find_audio_api(_optarg);
      bVar1 = is_compiled_audio_api(arg_audio_api);
      if (!bVar1) {
        pcVar3 = "Invalid audio system \'%s\'.\n";
LAB_00112b45:
        __stream = _stderr;
        __format = (char *)gettext(pcVar3);
        pcVar3 = _optarg;
LAB_00112b78:
        fprintf(__stream,__format,pcVar3);
        return 1;
      }
    }
    if (iVar2 != 0x43) {
      if (iVar2 == 0x4c) {
        std::__cxx11::string::string((string *)&local_58,_optarg,(allocator *)&local_38);
        dVar4 = std::__cxx11::stod(&local_58,(size_t *)0x0);
        arg_latency = dVar4 * 0.001;
        local_60 = arg_latency;
        std::__cxx11::string::~string((string *)&local_58);
        __stream = _stderr;
        if (local_60 <= 0.0) {
          pcVar3 = (char *)gettext("Invalid latency.");
          __format = "%s\n";
          goto LAB_00112b78;
        }
      }
      else {
        if (iVar2 != 0x4d) {
          if (iVar2 != -1) {
            usage();
            return 1;
          }
          if (_optind != argc) {
            return 1;
          }
          load_config();
          openlog("ADLrt",0,8);
          handle_signals();
          iVar2 = audio_main();
          return iVar2;
        }
        arg_midi_api = find_midi_api(_optarg);
        bVar1 = is_compiled_midi_api(arg_midi_api);
        if (!bVar1) {
          pcVar3 = "Invalid MIDI system \'%s\'.\n";
          goto LAB_00112b45;
        }
      }
      goto LAB_001129ee;
    }
    std::__cxx11::string::assign((char *)&arg_config_file_abi_cxx11_);
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    i18n_setup();
    midi_db.init();

    char *home_dir = getenv("HOME");
    if (home_dir) {
        arg_config_file = std::string(home_dir) + "/.config/adlrt.conf";
    }

    for (int c; (c = generic_getopt(argc, argv, "L:A:M:C", usage)) != -1;) {
        switch (c) {
        case 'C' : {
            ::arg_config_file = optarg;
            break;
        }
        case 'L': {
            double latency = ::arg_latency = std::stod(optarg) * 1e-3;
            if (latency <= 0) {
                fprintf(stderr, "%s\n", _("Invalid latency."));
                return 1;
            }
            break;
        }
        case 'A': {
            RtAudio::Api audio_api = ::arg_audio_api = find_audio_api(optarg);
            if (!is_compiled_audio_api(audio_api)) {
                fprintf(stderr, _("Invalid audio system '%s'.\n"), optarg);
                return 1;
            }
            break;
        }
        case 'M': {
            RtMidi::Api midi_api = ::arg_midi_api = find_midi_api(optarg);
            if (!is_compiled_midi_api(midi_api)) {
                fprintf(stderr, _("Invalid MIDI system '%s'.\n"), optarg);
                return 1;
            }
            break;
        }
        default:
            usage();
            return 1;
        }
    }

    if (argc != optind)
        return 1;

    load_config();

#ifdef ADLJACK_GTK3
    gtk_init(&argc, &argv);
#endif

#if !defined(_WIN32)
    openlog("ADLrt", 0, LOG_USER);
#endif

    handle_signals();
    return audio_main();
}